

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

limb_type math::wide_integer::uintwide_t<65536u,unsigned_int,std::allocator<unsigned_int>,false>::
          eval_multiply_1d<unsigned_int*,unsigned_int_const*>
                    (uint *r,uint *a,value_type_conflict b,unsigned_fast_type count)

{
  long lVar1;
  unsigned_fast_type i;
  unsigned_fast_type uVar2;
  ulong uVar3;
  
  if (b == 0) {
    uVar3 = 0;
    for (lVar1 = 0; count * 4 != lVar1; lVar1 = lVar1 + 4) {
      *(undefined4 *)((long)r + lVar1) = 0;
    }
  }
  else {
    uVar3 = 0;
    for (uVar2 = 0; count != uVar2; uVar2 = uVar2 + 1) {
      uVar3 = (ulong)a[uVar2] * (ulong)b + uVar3;
      r[uVar2] = (uint)uVar3;
      uVar3 = uVar3 >> 0x20;
    }
  }
  return (limb_type)uVar3;
}

Assistant:

static constexpr auto eval_multiply_1d(      ResultIterator                                               r,
                                                 InputIteratorLeft                                            a,
                                           const typename detail::iterator_detail::iterator_traits<InputIteratorLeft>::value_type b,
                                           const unsigned_fast_type                                           count) -> limb_type
    {
      using local_limb_type = typename detail::iterator_detail::iterator_traits<ResultIterator>::value_type;
      using left_value_type = typename detail::iterator_detail::iterator_traits<InputIteratorLeft>::value_type;

      static_assert
      (
        (std::numeric_limits<local_limb_type>::digits == std::numeric_limits<left_value_type>::digits),
        "Error: Internals require same widths for left-right-result limb_types at the moment"
      );

      using local_double_limb_type =
        typename detail::uint_type_helper<static_cast<size_t>(std::numeric_limits<local_limb_type>::digits * 2)>::exact_unsigned_type;

      auto carry = static_cast<local_double_limb_type>(UINT8_C(0));

      if(b == static_cast<left_value_type>(UINT8_C(0)))
      {
        detail::fill_unsafe(r, detail::advance_and_point(r, count), static_cast<limb_type>(UINT8_C(0)));
      }
      else
      {
        #if defined(WIDE_INTEGER_HAS_CLZ_LIMB_OPTIMIZATIONS)
        auto clz_a = static_cast<unsigned_fast_type>(UINT8_C(0));

        if(count > static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          using input_left_value_type  = typename detail::iterator_detail::iterator_traits<InputIteratorLeft>::value_type;

          auto it_leading_zeros_a = detail::advance_and_point(a, static_cast<unsigned_fast_type>(count - static_cast<unsigned_fast_type>(UINT8_C(1)))); // NOLINT(llvm-qualified-auto,readability-qualified-auto)

          while(   (it_leading_zeros_a != a) // NOLINT(altera-id-dependent-backward-branch)
                && (*it_leading_zeros_a == static_cast<input_left_value_type>(UINT8_C(0))))
          {
            --it_leading_zeros_a;

            ++clz_a;
          }
        }

        const auto imax = static_cast<unsigned_fast_type>(count - clz_a);

        #else

        const auto imax = count;

        #endif

        auto i = static_cast<unsigned_fast_type>(UINT8_C(0));

        for( ; i < imax; ++i) // NOLINT(altera-id-dependent-backward-branch)
        {
          carry =
            static_cast<local_double_limb_type>
            (
                carry
              + static_cast<local_double_limb_type>(static_cast<local_double_limb_type>(*a++) * b)
            );

          *r++  = static_cast<local_limb_type>(carry);
          carry = static_cast<local_double_limb_type>(detail::make_hi<local_limb_type>(carry));
        }

        #if defined(WIDE_INTEGER_HAS_CLZ_LIMB_OPTIMIZATIONS)
        for( ; i < count; ++i)
        {
          *r++  = static_cast<local_limb_type>(carry);
          carry = static_cast<local_double_limb_type>(UINT8_C(0));
        }
        #endif
      }

      return static_cast<local_limb_type>(carry);
    }